

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O3

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::SendV1Version
          (V2TransportTester *this,MessageStartChars *magic)

{
  FastRandomContext *this_00;
  uint64_t uVar1;
  long in_FS_OFFSET;
  CMessageHeader hdr;
  DataStream local_58;
  CMessageHeader local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->m_rng;
  do {
    uVar1 = RandomMixin<FastRandomContext>::randbits
                      (&this_00->super_RandomMixin<FastRandomContext>,4);
  } while (10 < uVar1);
  CMessageHeader::CMessageHeader(&local_38,magic,"version",(int)uVar1 + 0x7e);
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_read_pos = 0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  SerializeMany<DataStream,std::array<unsigned_char,4ul>,char[12],unsigned_int,unsigned_char[4]>
            (&local_58,&local_38.pchMessageStart,&local_38.pchCommand,&local_38.nMessageSize,
             &local_38.pchChecksum);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_to_send,
             (this->m_to_send).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start + local_58.m_read_pos,
             local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SendV1Version(const MessageStartChars& magic)
    {
        CMessageHeader hdr(magic, "version", 126 + m_rng.randrange(11));
        DataStream ser{};
        ser << hdr;
        m_to_send.insert(m_to_send.end(), UCharCast(ser.data()), UCharCast(ser.data() + ser.size()));
    }